

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_make_input_port(sexp ctx,FILE *in,sexp name)

{
  sexp psVar1;
  
  psVar1 = (sexp)sexp_alloc(ctx,0x58);
  if ((psVar1 != (sexp)0x0) && ((((ulong)psVar1 & 3) != 0 || (psVar1->tag != 0x13)))) {
    psVar1->tag = 0x10;
  }
  if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
    (psVar1->value).port.stream = in;
    (psVar1->value).type.name = name;
    (psVar1->value).port.line = 1;
    (psVar1->value).port.flags = 0xffffffffffffffff;
    (psVar1->value).type.setters = (sexp)0x0;
    (psVar1->value).uvector.length = 0x3e;
    *(undefined2 *)((long)&psVar1->value + 0x28) = 1;
    (psVar1->value).flonum_bits[0x2a] = '\x01';
    *(undefined4 *)((long)&psVar1->value + 0x2b) = 0;
    (psVar1->value).flonum_bits[0x2f] =
         (((ctx->value).type.setters)->value).context.mark_stack[6].prev !=
         (sexp_mark_stack_ptr_t *)0x3e;
    (psVar1->value).string.offset = 0x43e;
  }
  return psVar1;
}

Assistant:

sexp sexp_make_input_port (sexp ctx, FILE* in, sexp name) {
  sexp p = sexp_alloc_type(ctx, port, SEXP_IPORT);
  if (sexp_exceptionp(p)) return p;
  sexp_port_stream(p) = in;
  sexp_port_name(p) = name;
  sexp_port_line(p) = 1;
  sexp_port_flags(p) = SEXP_PORT_UNKNOWN_FLAGS;
  sexp_port_buf(p) = NULL;
  sexp_port_fd(p) = SEXP_FALSE;
  sexp_port_openp(p) = 1;
  sexp_port_bidirp(p) = 0;
  sexp_port_binaryp(p) = 1;
  sexp_port_shutdownp(p) = 0;
  sexp_port_no_closep(p) = 0;
  sexp_port_sourcep(p) = 0;
  sexp_port_blockedp(p) = 0;
#if SEXP_USE_FOLD_CASE_SYMS
  sexp_port_fold_casep(p) = sexp_truep(sexp_global(ctx, SEXP_G_FOLD_CASE_P));
#endif
#if SEXP_USE_UNIFY_FILENOS_BY_NUMBER
  /* if the fd was previously opened by a non-stream port, preserve it */
  /* here to avoid gc timing issues */
  if (in && fileno(in) >= 0) {
    sexp_port_fd(p) = sexp_lookup_fileno(ctx, fileno(in));
    if (sexp_filenop(sexp_port_fd(p))) {
      sexp_fileno_openp(sexp_port_fd(p)) = 1;
      ++sexp_fileno_count(sexp_port_fd(p));
    }
  }
#endif
  sexp_port_cookie(p) = SEXP_VOID;
  return p;
}